

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGetterCalls.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArrayGetterCalls::initTest(TextureCubeMapArrayGetterCalls *this)

{
  PNamesMap *pPVar1;
  PNamesVec *this_00;
  mapped_type_conflict *pmVar2;
  uint *puVar3;
  NotSupportedError *this_01;
  iterator iVar4;
  string local_50;
  
  if ((this->super_TestCaseBase).m_is_texture_cube_map_array_supported != false) {
    pPVar1 = &this->pnames_for_gettexparameter_default;
    local_50._M_dataplus._M_p._0_4_ = 0x813c;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = 0;
    local_50._M_dataplus._M_p._0_4_ = 0x813d;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = 1000;
    local_50._M_dataplus._M_p._0_4_ = 0x2801;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = 0x2702;
    local_50._M_dataplus._M_p._0_4_ = 0x2800;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = 0x2601;
    local_50._M_dataplus._M_p._0_4_ = 0x813a;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = -1000;
    local_50._M_dataplus._M_p._0_4_ = 0x813b;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = 1000;
    local_50._M_dataplus._M_p._0_4_ = 0x8e42;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = 0x1903;
    local_50._M_dataplus._M_p._0_4_ = 0x8e43;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = 0x1904;
    local_50._M_dataplus._M_p._0_4_ = 0x8e44;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = 0x1905;
    local_50._M_dataplus._M_p._0_4_ = 0x8e45;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = 0x1906;
    local_50._M_dataplus._M_p._0_4_ = 0x2802;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = 0x2901;
    local_50._M_dataplus._M_p._0_4_ = 0x2803;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = 0x2901;
    local_50._M_dataplus._M_p._0_4_ = 0x8072;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = 0x2901;
    pPVar1 = &this->pnames_for_gettexparameter_modified;
    local_50._M_dataplus._M_p._0_4_ = 0x813c;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = 1;
    local_50._M_dataplus._M_p._0_4_ = 0x813d;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = 1;
    local_50._M_dataplus._M_p._0_4_ = 0x2801;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = 0x2600;
    local_50._M_dataplus._M_p._0_4_ = 0x2800;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = 0x2600;
    local_50._M_dataplus._M_p._0_4_ = 0x813a;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = -10;
    local_50._M_dataplus._M_p._0_4_ = 0x813b;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = 10;
    local_50._M_dataplus._M_p._0_4_ = 0x8e42;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = 0x1904;
    local_50._M_dataplus._M_p._0_4_ = 0x8e43;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = 0x1905;
    local_50._M_dataplus._M_p._0_4_ = 0x8e44;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = 0x1906;
    local_50._M_dataplus._M_p._0_4_ = 0x8e45;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = 0x1903;
    local_50._M_dataplus._M_p._0_4_ = 0x2802;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = 0x812f;
    local_50._M_dataplus._M_p._0_4_ = 0x2803;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = 0x8370;
    local_50._M_dataplus._M_p._0_4_ = 0x8072;
    pmVar2 = std::
             map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
             ::operator[](pPVar1,(key_type *)&local_50);
    *pmVar2 = 0x812f;
    this_00 = &this->pnames_for_gettexlevelparameter;
    local_50._M_dataplus._M_p._0_4_ = 0x86a1;
    iVar4._M_current =
         (this->pnames_for_gettexlevelparameter).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    puVar3 = (this->pnames_for_gettexlevelparameter).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_50);
      iVar4._M_current =
           (this->pnames_for_gettexlevelparameter).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar3 = (this->pnames_for_gettexlevelparameter).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0x86a1;
      iVar4._M_current = iVar4._M_current + 1;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x805f;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_50);
      iVar4._M_current =
           (this->pnames_for_gettexlevelparameter).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar3 = (this->pnames_for_gettexlevelparameter).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0x805f;
      iVar4._M_current = iVar4._M_current + 1;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x805e;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_50);
      iVar4._M_current =
           (this->pnames_for_gettexlevelparameter).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar3 = (this->pnames_for_gettexlevelparameter).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0x805e;
      iVar4._M_current = iVar4._M_current + 1;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x805d;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_50);
      iVar4._M_current =
           (this->pnames_for_gettexlevelparameter).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar3 = (this->pnames_for_gettexlevelparameter).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0x805d;
      iVar4._M_current = iVar4._M_current + 1;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x805c;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_50);
      iVar4._M_current =
           (this->pnames_for_gettexlevelparameter).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar3 = (this->pnames_for_gettexlevelparameter).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0x805c;
      iVar4._M_current = iVar4._M_current + 1;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x884a;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_50);
      iVar4._M_current =
           (this->pnames_for_gettexlevelparameter).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar3 = (this->pnames_for_gettexlevelparameter).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0x884a;
      iVar4._M_current = iVar4._M_current + 1;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x8c3f;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_50);
      iVar4._M_current =
           (this->pnames_for_gettexlevelparameter).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar3 = (this->pnames_for_gettexlevelparameter).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0x8c3f;
      iVar4._M_current = iVar4._M_current + 1;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x88f1;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_50);
      iVar4._M_current =
           (this->pnames_for_gettexlevelparameter).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar3 = (this->pnames_for_gettexlevelparameter).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0x88f1;
      iVar4._M_current = iVar4._M_current + 1;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x8c13;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_50);
      iVar4._M_current =
           (this->pnames_for_gettexlevelparameter).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar3 = (this->pnames_for_gettexlevelparameter).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0x8c13;
      iVar4._M_current = iVar4._M_current + 1;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x8c12;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_50);
      iVar4._M_current =
           (this->pnames_for_gettexlevelparameter).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar3 = (this->pnames_for_gettexlevelparameter).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0x8c12;
      iVar4._M_current = iVar4._M_current + 1;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x8c11;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_50);
      iVar4._M_current =
           (this->pnames_for_gettexlevelparameter).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar3 = (this->pnames_for_gettexlevelparameter).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0x8c11;
      iVar4._M_current = iVar4._M_current + 1;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x8c10;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_50);
      iVar4._M_current =
           (this->pnames_for_gettexlevelparameter).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar3 = (this->pnames_for_gettexlevelparameter).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0x8c10;
      iVar4._M_current = iVar4._M_current + 1;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x8c16;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_50);
      iVar4._M_current =
           (this->pnames_for_gettexlevelparameter).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar3 = (this->pnames_for_gettexlevelparameter).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0x8c16;
      iVar4._M_current = iVar4._M_current + 1;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x1003;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_50);
      iVar4._M_current =
           (this->pnames_for_gettexlevelparameter).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar3 = (this->pnames_for_gettexlevelparameter).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0x1003;
      iVar4._M_current = iVar4._M_current + 1;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x1000;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_50);
      iVar4._M_current =
           (this->pnames_for_gettexlevelparameter).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar3 = (this->pnames_for_gettexlevelparameter).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0x1000;
      iVar4._M_current = iVar4._M_current + 1;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x1001;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_50);
      iVar4._M_current =
           (this->pnames_for_gettexlevelparameter).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      puVar3 = (this->pnames_for_gettexlevelparameter).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 0x1001;
      iVar4._M_current = iVar4._M_current + 1;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current;
    }
    local_50._M_dataplus._M_p._0_4_ = 0x8071;
    if (iVar4._M_current == puVar3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar4,(uint *)&local_50);
    }
    else {
      *iVar4._M_current = 0x8071;
      (this->pnames_for_gettexlevelparameter).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Texture cube map array functionality not supported, skipping","");
  tcu::NotSupportedError::NotSupportedError(this_01,&local_50);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureCubeMapArrayGetterCalls::initTest(void)
{
	/* Only execute if GL_EXT_texture_cube_map_array extension is supported */
	if (!m_is_texture_cube_map_array_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_CUBE_MAP_ARRAY_EXTENSION_NOT_SUPPORTED);
	}

	pnames_for_gettexparameter_default[GL_TEXTURE_BASE_LEVEL] = 0;
	pnames_for_gettexparameter_default[GL_TEXTURE_MAX_LEVEL]  = 1000;
	pnames_for_gettexparameter_default[GL_TEXTURE_MIN_FILTER] = GL_NEAREST_MIPMAP_LINEAR;
	pnames_for_gettexparameter_default[GL_TEXTURE_MAG_FILTER] = GL_LINEAR;
	pnames_for_gettexparameter_default[GL_TEXTURE_MIN_LOD]	= -1000;
	pnames_for_gettexparameter_default[GL_TEXTURE_MAX_LOD]	= 1000;
	pnames_for_gettexparameter_default[GL_TEXTURE_SWIZZLE_R]  = GL_RED;
	pnames_for_gettexparameter_default[GL_TEXTURE_SWIZZLE_G]  = GL_GREEN;
	pnames_for_gettexparameter_default[GL_TEXTURE_SWIZZLE_B]  = GL_BLUE;
	pnames_for_gettexparameter_default[GL_TEXTURE_SWIZZLE_A]  = GL_ALPHA;
	pnames_for_gettexparameter_default[GL_TEXTURE_WRAP_S]	 = GL_REPEAT;
	pnames_for_gettexparameter_default[GL_TEXTURE_WRAP_T]	 = GL_REPEAT;
	pnames_for_gettexparameter_default[GL_TEXTURE_WRAP_R]	 = GL_REPEAT;

	pnames_for_gettexparameter_modified[GL_TEXTURE_BASE_LEVEL] = 1;
	pnames_for_gettexparameter_modified[GL_TEXTURE_MAX_LEVEL]  = 1;
	pnames_for_gettexparameter_modified[GL_TEXTURE_MIN_FILTER] = GL_NEAREST;
	pnames_for_gettexparameter_modified[GL_TEXTURE_MAG_FILTER] = GL_NEAREST;
	pnames_for_gettexparameter_modified[GL_TEXTURE_MIN_LOD]	= -10;
	pnames_for_gettexparameter_modified[GL_TEXTURE_MAX_LOD]	= 10;
	pnames_for_gettexparameter_modified[GL_TEXTURE_SWIZZLE_R]  = GL_GREEN;
	pnames_for_gettexparameter_modified[GL_TEXTURE_SWIZZLE_G]  = GL_BLUE;
	pnames_for_gettexparameter_modified[GL_TEXTURE_SWIZZLE_B]  = GL_ALPHA;
	pnames_for_gettexparameter_modified[GL_TEXTURE_SWIZZLE_A]  = GL_RED;
	pnames_for_gettexparameter_modified[GL_TEXTURE_WRAP_S]	 = GL_CLAMP_TO_EDGE;
	pnames_for_gettexparameter_modified[GL_TEXTURE_WRAP_T]	 = GL_MIRRORED_REPEAT;
	pnames_for_gettexparameter_modified[GL_TEXTURE_WRAP_R]	 = GL_CLAMP_TO_EDGE;

	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_COMPRESSED);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_ALPHA_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_BLUE_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_GREEN_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_RED_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_DEPTH_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_SHARED_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_STENCIL_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_ALPHA_TYPE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_BLUE_TYPE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_GREEN_TYPE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_RED_TYPE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_DEPTH_TYPE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_INTERNAL_FORMAT);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_WIDTH);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_HEIGHT);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_DEPTH);
}